

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_start_buffer(nk_context *ctx,nk_command_buffer *buffer)

{
  nk_command_buffer *buffer_local;
  nk_context *ctx_local;
  
  if ((ctx != (nk_context *)0x0) && (buffer != (nk_command_buffer *)0x0)) {
    buffer->begin = (ctx->memory).allocated;
    buffer->end = buffer->begin;
    buffer->last = buffer->begin;
    (buffer->clip).x = -8192.0;
    (buffer->clip).y = -8192.0;
    (buffer->clip).w = 16384.0;
    (buffer->clip).h = 16384.0;
  }
  return;
}

Assistant:

NK_INTERN void
nk_start_buffer(struct nk_context *ctx, struct nk_command_buffer *buffer)
{
    NK_ASSERT(ctx);
    NK_ASSERT(buffer);
    if (!ctx || !buffer) return;
    buffer->begin = ctx->memory.allocated;
    buffer->end = buffer->begin;
    buffer->last = buffer->begin;
    buffer->clip = nk_null_rect;
}